

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIterationDynamicSlices(void)

{
  pointer ptVar1;
  ostream *poVar2;
  pointer ptVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_60;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_48;
  Span<const_int,_18446744073709551615UL> local_20;
  
  local_48.m_begin.m_ptr = (pointer)0x200000001;
  local_48.m_begin.m_stride = 0x400000003;
  local_48.m_end.m_ptr = (pointer)0x600000005;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_20);
  local_20.m_ptr = (pointer)0x0;
  if ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_20.m_ptr =
         local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_20.m_size.m_size =
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_48,&local_20,3);
  if (local_48.m_begin.m_ptr != local_48.m_end.m_ptr ||
      (local_48.m_end.m_stride ^ local_48.m_begin.m_stride) != 0) {
    if (local_48.m_begin.m_stride != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x261);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(row.Size()) == (size_t(3))",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
LAB_001c0f3f:
      iVar5 = 1;
      goto LAB_001c0f44;
    }
    iVar4 = 0;
    ptVar3 = local_48.m_begin.m_ptr;
    do {
      ptVar1 = ptVar3 + 3;
      lVar6 = -0xc;
      iVar5 = iVar4;
      do {
        iVar4 = *(int *)((long)ptVar3 + lVar6 + 0xc);
        if (iVar4 != iVar5 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                     ,0x71);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x264);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(i) == (++counter)",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          goto LAB_001c0f3f;
        }
        lVar6 = lVar6 + 4;
        iVar5 = iVar4;
      } while (lVar6 != 0);
      ptVar3 = ptVar1;
    } while (ptVar1 != local_48.m_end.m_ptr ||
             (local_48.m_end.m_stride ^ local_48.m_begin.m_stride) != 0);
    iVar5 = 0;
    if (iVar4 == 6) goto LAB_001c0f44;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x267);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(counter) == (6)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  iVar5 = 1;
  std::ostream::flush();
LAB_001c0f44:
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int testSpanTestsIterationDynamicSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices(3)) {
        ML_ASSERT_EQ(row.Size(), size_t(3));

        for (auto i : row) {
            ML_ASSERT_EQ(i, ++counter);
        }
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}